

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  int iVar1;
  pointer pcVar2;
  size_type sVar3;
  cmSourceFile *pcVar4;
  _Alloc_hider _Var5;
  string *psVar6;
  mapped_type_conflict *pmVar7;
  _Base_ptr p_Var8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  bool keptSourceExtension;
  string objectNameLower;
  string dir_max;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  string local_170;
  _Base_ptr local_150;
  cmLocalGenerator *local_148;
  string local_140;
  undefined1 local_120 [48];
  map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_f0;
  undefined1 local_e8 [48];
  string local_b8;
  cmGeneratorTarget *local_98;
  string local_90;
  undefined1 local_70 [8];
  _Rb_tree_node_base local_68;
  pointer local_48;
  undefined8 local_40;
  pointer local_38;
  
  local_f0 = mapping;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  sVar3 = psVar6->_M_string_length;
  local_e8._8_8_ = local_e8 + 0x10;
  local_e8._0_8_ = (_Base_ptr)0x1;
  local_e8[0x10] = '/';
  local_148 = &this->super_cmLocalGenerator;
  local_98 = gt;
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])(&local_170,this,gt);
  local_68._M_parent = (_Base_ptr)local_e8._0_8_;
  local_68._M_left = (_Base_ptr)local_e8._8_8_;
  local_68._M_right = (_Base_ptr)local_170._M_string_length;
  local_48 = local_170._M_dataplus._M_p;
  local_120._8_8_ = local_120 + 0x10;
  local_120._0_8_ = (_Base_ptr)0x1;
  local_120[0x10] = 0x2f;
  local_40 = 1;
  views._M_len = 4;
  views._M_array = (iterator)local_70;
  local_70 = (undefined1  [8])sVar3;
  local_68._0_8_ = pcVar2;
  local_38 = (pointer)local_120._8_8_;
  cmCatViews_abi_cxx11_(&local_90,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_68._M_left = &local_68;
  local_68._0_8_ = local_68._0_8_ & 0xffffffff00000000;
  local_68._M_parent = (_Base_ptr)0x0;
  local_48 = (pointer)0x0;
  p_Var8 = (local_f0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_150 = &(local_f0->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_68._M_right = local_68._M_left;
  if (p_Var8 != local_150) {
    do {
      pcVar4 = *(cmSourceFile **)(p_Var8 + 1);
      psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar4);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_140,psVar6);
      cmsys::SystemTools::LowerCase(&local_170,&local_140);
      sVar3 = local_170._M_string_length;
      _Var5._M_p = local_170._M_dataplus._M_p;
      cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                (&local_b8,local_148->GlobalGenerator,pcVar4);
      local_120._0_8_ = sVar3;
      local_120._8_8_ = _Var5._M_p;
      local_120._16_8_ = local_b8._M_string_length;
      local_120._24_8_ = local_b8._M_dataplus._M_p;
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_120;
      cmCatViews_abi_cxx11_((string *)local_e8,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_70,(string *)local_e8);
      *pmVar7 = *pmVar7 + 1;
      if ((_Base_ptr)local_e8._0_8_ != (_Base_ptr)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_150);
    p_Var8 = (local_f0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if (p_Var8 != local_150) {
    do {
      pcVar4 = *(cmSourceFile **)(p_Var8 + 1);
      psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar4);
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_170,psVar6);
      sVar3 = local_170._M_string_length;
      _Var5._M_p = local_170._M_dataplus._M_p;
      cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
                (&local_140,local_148->GlobalGenerator,pcVar4);
      local_120._0_8_ = sVar3;
      local_120._8_8_ = _Var5._M_p;
      local_120._16_8_ = local_140._M_string_length;
      local_120._24_8_ = local_140._M_dataplus._M_p;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_120;
      cmCatViews_abi_cxx11_((string *)local_e8,views_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::LowerCase((string *)local_120,(string *)local_e8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)local_70,(string *)local_120);
      iVar1 = *pmVar7;
      if ((_Base_ptr)local_120._0_8_ != (_Base_ptr)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
      }
      if (1 < iVar1) {
        cmGeneratorTarget::AddExplicitObjectName(local_98,pcVar4);
        cmLocalGenerator::GetObjectFileNameWithoutTarget
                  ((string *)local_120,local_148,pcVar4,&local_90,(bool *)&local_170,(char *)0x0);
        std::__cxx11::string::operator=((string *)local_e8,(string *)local_120);
        if ((_Base_ptr)local_120._0_8_ != (_Base_ptr)(local_120 + 0x10)) {
          operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
        }
        cmsys::SystemTools::ReplaceString((string *)local_e8,"/","_");
      }
      std::__cxx11::string::_M_assign((string *)&p_Var8[1]._M_parent);
      if ((_Base_ptr)local_e8._0_8_ != (_Base_ptr)(local_e8 + 0x10)) {
        operator_delete((void *)local_e8._0_8_,CONCAT71(local_e8._17_7_,local_e8[0x10]) + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_150);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max = cmStrCat(this->GetCurrentBinaryDirectory(), '/',
                                 this->GetTargetDirectory(gt), '/');

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmStrCat(
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath())),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName = cmStrCat(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}